

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription_storage_iface.hpp
# Opt level: O1

void __thiscall
so_5::impl::subscription_storage_common::subscr_info_t::subscr_info_t
          (subscr_info_t *this,mbox_t *mbox,type_index msg_type,state_t *state,
          event_handler_method_t *method,thread_safety_t thread_safety)

{
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  (this->m_mbox).m_obj = mbox->m_obj;
  mbox->m_obj = (abstract_message_box_t *)0x0;
  (this->m_msg_type)._M_target = msg_type._M_target;
  this->m_state = state;
  std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::function
            ((function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)> *)
             &local_38,method);
  *(undefined8 *)&(this->m_handler).m_method.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_handler).m_method.super__Function_base._M_functor + 8) = 0;
  (this->m_handler).m_method.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_handler).m_method._M_invoker = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    *(void **)&(this->m_handler).m_method.super__Function_base._M_functor =
         local_38._M_unused._M_object;
    *(undefined8 *)((long)&(this->m_handler).m_method.super__Function_base._M_functor + 8) =
         local_38._8_8_;
    (this->m_handler).m_method.super__Function_base._M_manager = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  (this->m_handler).m_thread_safety = thread_safety;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

subscr_info_t(
			mbox_t mbox,
			std::type_index msg_type,
			const state_t & state,
			const event_handler_method_t & method,
			thread_safety_t thread_safety )
			:	m_mbox( std::move( mbox ) )
			,	m_msg_type( std::move( msg_type ) )
			,	m_state( &state )
			,	m_handler( method, thread_safety )
			{}